

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O0

void __thiscall
s2builderutil::IdentitySnapFunction::set_snap_radius(IdentitySnapFunction *this,S1Angle snap_radius)

{
  bool bVar1;
  ostream *poVar2;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  double local_28;
  S1Angle local_20;
  IdentitySnapFunction *local_18;
  IdentitySnapFunction *this_local;
  S1Angle snap_radius_local;
  
  local_20.radians_ = snap_radius.radians_;
  local_18 = this;
  this_local = (IdentitySnapFunction *)snap_radius.radians_;
  local_28 = (double)S2Builder::SnapFunction::kMaxSnapRadius();
  bVar1 = operator<=(local_20,(S1Angle)local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    (this->snap_radius_).radians_ = (double)this_local;
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
             ,0x32,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_40);
  poVar2 = std::operator<<(poVar2,"Check failed: (snap_radius) <= (kMaxSnapRadius()) ");
  S2LogMessageVoidify::operator&(&local_29,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
}

Assistant:

void IdentitySnapFunction::set_snap_radius(S1Angle snap_radius) {
  S2_DCHECK_LE(snap_radius, kMaxSnapRadius());
  snap_radius_ = snap_radius;
}